

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen.cpp
# Opt level: O2

void phaeton::CodeGen::unpackPairList(TupleList *TList,List *Left,List *Right)

{
  pointer piVar1;
  pointer pvVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> *T;
  pointer pvVar7;
  int R;
  int L;
  int local_38;
  int local_34;
  
  bVar4 = isPairList(TList);
  if (bVar4) {
    piVar1 = (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar1) {
      (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    piVar1 = (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar1) {
      (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    pvVar2 = (TList->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar7 = (TList->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar2; pvVar7 = pvVar7 + 1)
    {
      piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar3[1];
      iVar5 = *piVar3;
      if (iVar6 <= *piVar3) {
        iVar5 = iVar6;
      }
      if (iVar6 < *piVar3) {
        iVar6 = *piVar3;
      }
      _local_38 = CONCAT44(iVar5,iVar6);
      std::vector<int,_std::allocator<int>_>::push_back(Left,&local_34);
      std::vector<int,_std::allocator<int>_>::push_back(Right,&local_38);
    }
    return;
  }
  __assert_fail("isPairList(TList)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/CodeGen/CodeGen.cpp"
                ,0xa6,
                "static void phaeton::CodeGen::unpackPairList(const TupleList &, List &, List &)");
}

Assistant:

void CodeGen::unpackPairList(const TupleList &TList, List &Left, List &Right) {
  assert(isPairList(TList));

  Left.clear();
  Right.clear();
  for (const auto &T : TList) {
    int L = (T[0] < T[1]) ? T[0] : T[1];
    int R = (T[0] < T[1]) ? T[1] : T[0];
    Left.push_back(L);
    Right.push_back(R);
  }
}